

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O3

CURLcode smb_send_and_recv(Curl_easy *data,void **msg)

{
  size_t *psVar1;
  dynbuf *pdVar2;
  connectdata *pcVar3;
  connectdata *pcVar4;
  size_t sVar5;
  size_t sVar6;
  unsigned_short uVar7;
  CURLcode CVar8;
  uint uVar9;
  uint uVar10;
  char *pcVar11;
  _Bool eos;
  size_t nread;
  _Bool local_39;
  char *local_38;
  
  pcVar3 = data->conn;
  *msg = (void *)0x0;
  if ((pcVar3->proto).ftpc.pp.sendbuf.leng == 0) {
    pcVar11 = (pcVar3->proto).ftpc.pp.sendbuf.bufr;
    if (pcVar11 == (char *)0x0) goto LAB_001543c6;
    local_38 = (char *)0x9000;
    if (pcVar11 < (char *)0x9000) {
      local_38 = pcVar11;
    }
    CVar8 = Curl_client_read(data,(pcVar3->proto).smbc.send_buf,(size_t)local_38,(size_t *)&local_38
                             ,&local_39);
    if ((CVar8 != CURLE_AGAIN) && (CVar8 != CURLE_OK)) {
      return CVar8;
    }
    if (local_38 == (char *)0x0) {
      return CURLE_OK;
    }
    pdVar2 = &(pcVar3->proto).ftpc.pp.sendbuf;
    pdVar2->bufr = pdVar2->bufr + -(long)local_38;
    (pcVar3->proto).ftpc.pp.sendbuf.leng = (size_t)local_38;
    (pcVar3->proto).ftpc.pp.sendbuf.allc = 0;
  }
  pcVar4 = data->conn;
  sVar5 = (pcVar4->proto).ftpc.pp.sendbuf.leng;
  if (sVar5 != 0) {
    sVar6 = (pcVar4->proto).ftpc.pp.sendbuf.allc;
    pcVar11 = (char *)(sVar5 - sVar6);
    CVar8 = Curl_xfer_send(data,(pcVar4->proto).smbc.send_buf + sVar6,(size_t)pcVar11,false,
                           (size_t *)&local_38);
    if (CVar8 != CURLE_OK) {
      return CVar8;
    }
    if (local_38 == pcVar11) {
      (pcVar4->proto).ftpc.pp.sendbuf.leng = 0;
    }
    else {
      psVar1 = &(pcVar4->proto).ftpc.pp.sendbuf.allc;
      *psVar1 = (size_t)(local_38 + *psVar1);
    }
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.leng != 0) {
    return CURLE_AGAIN;
  }
  if ((pcVar3->proto).ftpc.pp.sendbuf.bufr != (char *)0x0) {
    return CURLE_AGAIN;
  }
LAB_001543c6:
  pcVar3 = data->conn;
  pcVar11 = (pcVar3->proto).smbc.recv_buf;
  sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
  CVar8 = Curl_xfer_recv(data,pcVar11 + sVar5,0x9000 - sVar5,(ssize_t *)&local_38);
  if (CVar8 != CURLE_OK) {
    return CVar8;
  }
  if (local_38 == (char *)0x0) {
    return CURLE_OK;
  }
  sVar5 = (pcVar3->proto).ftpc.pp.sendbuf.toobig;
  (pcVar3->proto).ftpc.pp.sendbuf.toobig = (size_t)(local_38 + sVar5);
  if (local_38 + sVar5 < (char *)0x4) {
    return CURLE_OK;
  }
  uVar7 = Curl_read16_be((uchar *)(pcVar11 + 2));
  if ((ulong)uVar7 + 4 <= (pcVar3->proto).ftpc.pp.sendbuf.toobig) {
    if (0x20 < uVar7) {
      uVar9 = (uint)(byte)pcVar11[0x24] * 2 + 0x27;
      uVar10 = (uint)((ulong)uVar7 + 4);
      if ((uVar9 <= uVar10) &&
         (uVar7 = Curl_read16_le((uchar *)(pcVar11 + (ulong)((uint)(byte)pcVar11[0x24] * 2) + 0x25))
         , uVar10 < uVar9 + uVar7)) {
        return CURLE_READ_ERROR;
      }
    }
    *msg = pcVar11;
    return CURLE_OK;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smb_send_and_recv(struct Curl_easy *data, void **msg)
{
  struct connectdata *conn = data->conn;
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;
  *msg = NULL; /* if it returns early */

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > (size_t)MAX_MESSAGE_SIZE ?
      (size_t)MAX_MESSAGE_SIZE : smbc->upload_size;
    bool eos;

    result = Curl_client_read(data, smbc->send_buf, nread, &nread, &eos);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(data);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(data, msg);
}